

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

size_t __thiscall
anon_unknown.dwarf_1e49a5::filename_pos(anon_unknown_dwarf_1e49a5 *this,StringRef str,Style style)

{
  anon_unknown_dwarf_1e49a5 *paVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  StringRef Chars;
  StringRef local_20;
  
  local_20.Length = (size_t)str.Data;
  iVar3 = (int)str.Length;
  if ((char *)local_20.Length == (char *)0x0) {
    pcVar2 = (char *)0xffffffffffffffff;
  }
  else {
    pcVar2 = (char *)(local_20.Length + -1);
    if ((this + -1)[local_20.Length] == (anon_unknown_dwarf_1e49a5)0x2f) {
      return (size_t)pcVar2;
    }
    if (iVar3 == 0 && (this + -1)[local_20.Length] == (anon_unknown_dwarf_1e49a5)0x5c) {
      return (size_t)pcVar2;
    }
  }
  bVar5 = iVar3 == 0;
  pcVar4 = "/";
  if (bVar5) {
    pcVar4 = "\\/";
  }
  Chars.Length = (ulong)bVar5 + 1;
  Chars.Data = pcVar4;
  local_20.Data = (char *)this;
  pcVar2 = (char *)llvm::StringRef::find_last_of(&local_20,Chars,(size_t)pcVar2);
  if (pcVar2 == (char *)0xffffffffffffffff && bVar5) {
    pcVar4 = (char *)(local_20.Length + -2);
    if (local_20.Length < (char *)(local_20.Length + -2)) {
      pcVar4 = (char *)local_20.Length;
    }
    do {
      pcVar2 = pcVar4 + -1;
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      paVar1 = (anon_unknown_dwarf_1e49a5 *)(local_20.Data + -1) + (long)pcVar4;
      pcVar4 = pcVar2;
    } while (*paVar1 != (anon_unknown_dwarf_1e49a5)0x3a);
  }
  if (pcVar2 == (char *)0xffffffffffffffff) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (pcVar2 == (char *)0x1) {
      if ((char *)local_20.Length == (char *)0x0) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      if ((anon_unknown_dwarf_1e49a5)*local_20.Data == (anon_unknown_dwarf_1e49a5)0x2f) {
        return 0;
      }
      if (iVar3 == 0 && (anon_unknown_dwarf_1e49a5)*local_20.Data == (anon_unknown_dwarf_1e49a5)0x5c
         ) {
        return 0;
      }
    }
    pcVar2 = pcVar2 + 1;
  }
  return (size_t)pcVar2;
}

Assistant:

size_t filename_pos(StringRef str, Style style) {
    if (str.size() > 0 && is_separator(str[str.size() - 1], style))
      return str.size() - 1;

    size_t pos = str.find_last_of(separators(style), str.size() - 1);

    if (real_style(style) == Style::windows) {
      if (pos == StringRef::npos)
        pos = str.find_last_of(':', str.size() - 2);
    }

    if (pos == StringRef::npos || (pos == 1 && is_separator(str[0], style)))
      return 0;

    return pos + 1;
  }